

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O0

Ref trun::DynLibLinux::Create(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ref RVar1;
  shared_ptr<trun::DynLibLinux> local_20;
  
  std::make_shared<trun::DynLibLinux>();
  std::shared_ptr<trun::IDynLibrary>::shared_ptr<trun::DynLibLinux,void>
            ((shared_ptr<trun::IDynLibrary> *)in_RDI,&local_20);
  std::shared_ptr<trun::DynLibLinux>::~shared_ptr(&local_20);
  RVar1.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar1.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ref)RVar1.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IDynLibrary::Ref DynLibLinux::Create() {
    return std::make_shared<DynLibLinux>();
}